

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

wstring * __thiscall
mjs::property_name_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,expression *e)

{
  bool bVar1;
  int iVar2;
  token_type tVar3;
  wstring *pwVar4;
  token *this_00;
  mjs *this_01;
  double m;
  token *lt;
  expression *e_local;
  
  this_01 = this;
  bVar1 = is_valid_property_name_expression((expression *)this);
  if (!bVar1) {
    __assert_fail("is_valid_property_name_expression(e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x95,"std::wstring mjs::property_name_string(const expression &)");
  }
  iVar2 = (**(code **)(*(long *)this + 0x18))();
  if (iVar2 == 0) {
    pwVar4 = identifier_expression::id_abi_cxx11_((identifier_expression *)this);
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)pwVar4);
  }
  else {
    this_00 = literal_expression::t((literal_expression *)this);
    tVar3 = token::type(this_00);
    if (tVar3 == string_literal) {
      pwVar4 = token::text_abi_cxx11_(this_00);
      std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)pwVar4);
    }
    else {
      tVar3 = token::type(this_00);
      if (tVar3 != numeric_literal) {
        __assert_fail("lt.type() == token_type::numeric_literal",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                      ,0x9d,"std::wstring mjs::property_name_string(const expression &)");
      }
      m = token::dvalue(this_00);
      number_to_string_abi_cxx11_(__return_storage_ptr__,this_01,m);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring property_name_string(const expression& e) {
    assert(is_valid_property_name_expression(e));
    if (e.type() == expression_type::identifier) {
        return static_cast<const identifier_expression&>(e).id();
    }
    const auto& lt = static_cast<const literal_expression&>(e).t();
    if (lt.type() == token_type::string_literal) {
        return lt.text();
    } else {
        assert(lt.type() == token_type::numeric_literal);
        return number_to_string(lt.dvalue());
    }
}